

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

Result_Type
chaiscript::detail::Cast_Helper_Inner<std::shared_ptr<const_std::runtime_error>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  Type_Info *this;
  shared_ptr<std::runtime_error> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  shared_ptr<const_std::runtime_error> sVar3;
  Result_Type RVar4;
  element_type *this_00;
  
  this_00 = in_RDI;
  this = Boxed_Value::get_type_info((Boxed_Value *)0x371f39);
  bVar1 = Type_Info::is_const(this);
  if (bVar1) {
    Boxed_Value::get((Boxed_Value *)0x371f6f);
    Any::cast<std::shared_ptr<std::runtime_error_const>>((Any *)this_00);
    std::shared_ptr<const_std::runtime_error>::shared_ptr
              ((shared_ptr<const_std::runtime_error> *)this_00,
               (shared_ptr<const_std::runtime_error> *)in_RDI);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    Boxed_Value::get((Boxed_Value *)0x371f4f);
    Any::cast<std::shared_ptr<std::runtime_error>>((Any *)this_00);
    sVar3 = std::const_pointer_cast<std::runtime_error_const,std::runtime_error>(in_RDX);
    _Var2 = sVar3.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  RVar4.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  RVar4.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (Result_Type)RVar4.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (!ob.get_type_info().is_const())
          {
            return std::const_pointer_cast<const Result>(ob.get().cast<std::shared_ptr<Result> >());
          } else {
            return ob.get().cast<std::shared_ptr<const Result> >();
          }
        }